

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O2

bool __thiscall
pg::TLSolver::attractTangle(TLSolver *this,int t,int pl,bitset *R,bitset *Z,int maxpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer puVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  _label_vertex local_40;
  
  piVar4 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar14 = piVar4[t];
  if ((uVar14 & 1) == pl && ((int)uVar14 <= maxpr && uVar14 != 0xffffffff)) {
    puVar5 = (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = puVar5[t];
    if (uVar14 == 0) {
      uVar14 = 0;
      for (piVar10 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_start[t]; uVar9 = (ulong)*piVar10,
          uVar9 != 0xffffffffffffffff; piVar10 = piVar10 + 1) {
        uVar14 = uVar14 + (((this->G)._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0);
      }
    }
    puVar5[t] = uVar14 - 1;
    if ((int)uVar14 < 2) {
      puVar13 = (uint *)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_start[t];
      puVar12 = puVar13;
      do {
        uVar9 = (ulong)(int)*puVar12;
        if (uVar9 == 0xffffffffffffffff) {
          if (maxpr == 0x7fffffff) {
            piVar4[t] = -1;
          }
          while( true ) {
            uVar1 = *puVar13;
            uVar9 = (ulong)(int)uVar1;
            if (uVar9 == 0xffffffffffffffff) break;
            uVar11 = uVar9 >> 6;
            uVar6 = Z->_bits[uVar11];
            if (((uVar6 >> (uVar9 & 0x3f) & 1) == 0) &&
               (uVar8 = 1L << (uVar9 & 0x3f), (R->_bits[uVar11] & uVar8) != 0)) {
              uVar2 = puVar13[1];
              Z->_bits[uVar11] = uVar6 | uVar8;
              this->str[uVar9] = uVar2;
              iVar3 = (this->Q).pointer;
              (this->Q).pointer = iVar3 + 1;
              (this->Q).queue[iVar3] = uVar1;
              if (2 < (this->super_Solver).trace) {
                poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m")
                ;
                local_40.g = (this->super_Solver).game;
                local_40.v = uVar1;
                poVar7 = operator<<(poVar7,&local_40);
                poVar7 = std::operator<<(poVar7,"\x1b[m by \x1b[1;36m");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,pl);
                std::operator<<(poVar7,"\x1b[m");
                poVar7 = std::operator<<((this->super_Solver).logger," (via tangle ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,t);
                poVar7 = std::operator<<(poVar7,")");
                std::endl<char,std::char_traits<char>>(poVar7);
              }
            }
            puVar13 = puVar13 + 2;
          }
          return true;
        }
        puVar12 = puVar12 + 2;
      } while (((this->G)._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0);
      piVar4[t] = -1;
    }
  }
  return false;
}

Assistant:

bool
TLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, int maxpr)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (tangle_pr > maxpr) return false; // too high...
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if the tangle can escape to R\Z.
     */
    {
        int e = tescs[t];
        if (e == 0) {
            int v, *ptr = tout[t];
            while ((v=*ptr++) != -1) {
                if (G[v]) e++;
            }
        }
        tescs[t] = --e;
        if (e > 0) return false;
    }

    /**
     * On-the-fly detect out-of-game tangles
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            }
        }
    }

    if (maxpr == INT_MAX) {
        // attracted to a dominion, so delete the tangle
        tpr[t] = -1;
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            if (!R[v]) continue; // not in <R> (might be higher region)
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}